

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

int poptSaveInt(int *arg,uint argInfo,long aLong)

{
  int iVar1;
  longlong lVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = -0x14;
  if (((ulong)arg & 3) == 0 && arg != (int *)0x0) {
    if (aLong == 0) {
      aLong = 0;
    }
    else if ((argInfo >> 0x16 & 1) != 0) {
      lVar2 = poptRandomValue(aLong);
      aLong = (long)(int)lVar2;
      if (aLong < 0) {
        return (int)lVar2;
      }
    }
    uVar3 = argInfo >> 0x19 & 7;
    iVar1 = -0x13;
    if (uVar3 < 5) {
      uVar4 = (uint)aLong ^ (int)(argInfo << 7) >> 0x1f;
      switch(uVar3) {
      case 0:
        *arg = uVar4;
        break;
      case 1:
        *arg = *arg ^ uVar4;
        break;
      case 2:
        *arg = *arg & uVar4;
        break;
      case 3:
        goto switchD_00103410_caseD_3;
      case 4:
        *arg = *arg | uVar4;
      }
      iVar1 = 0;
    }
  }
switchD_00103410_caseD_3:
  return iVar1;
}

Assistant:

int poptSaveInt(int * arg, unsigned int argInfo, long aLong)
{
    /* XXX Check alignment, may fail on funky platforms. */
    if (arg == NULL || (((unsigned long)arg) & (ALIGNOF(*arg)-1)))
	return POPT_ERROR_NULLARG;

    if (aLong != 0 && LF_ISSET(RANDOM)) {
	aLong = (int)poptRandomValue(aLong);
	if (aLong < 0)
	    return aLong;
    }
    if (LF_ISSET(NOT))
	aLong = ~aLong;
    switch (LF_ISSET(LOGICALOPS)) {
    case 0:		   *arg = (int) aLong;				break;
    case POPT_ARGFLAG_OR:  *(unsigned int *)arg |= (unsigned int) aLong; break;
    case POPT_ARGFLAG_AND: *(unsigned int *)arg &= (unsigned int) aLong; break;
    case POPT_ARGFLAG_XOR: *(unsigned int *)arg ^= (unsigned int) aLong; break;
    default:
	return POPT_ERROR_BADOPERATION;
	break;
    }
    return 0;
}